

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

Roman_int * get_numeral(Roman_int *__return_storage_ptr__,istream *is)

{
  bool bVar1;
  istream *piVar2;
  string local_1c8;
  char local_191;
  ostringstream local_190 [7];
  char ch;
  ostringstream ss;
  istream *is_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  do {
    piVar2 = std::operator>>(is,&local_191);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) {
LAB_00105871:
      std::__cxx11::ostringstream::str();
      Roman_int::Roman_int(__return_storage_ptr__,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_190);
      return __return_storage_ptr__;
    }
    bVar1 = is_numeral(local_191);
    if (!bVar1) {
      std::istream::unget();
      goto LAB_00105871;
    }
    std::operator<<((ostream *)local_190,local_191);
  } while( true );
}

Assistant:

Roman_int get_numeral(std::istream& is)
{
	std::ostringstream ss;
	char ch;
	while (is >> ch)
	{
		if (!is_numeral(ch))
		{
			is.unget();
			break;
		}
		ss << ch;
	}
	return Roman_int{ ss.str() };
}